

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

unsigned_long __thiscall UniValue::getInt<unsigned_long>(UniValue *this)

{
  long lVar1;
  unsigned_long *__value;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  runtime_error *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_long> _Var5;
  char *first_nonmatching;
  unsigned_long result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  VType *in_stack_ffffffffffffffb8;
  UniValue *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  unsigned_long local_18;
  int __base;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  checkType(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __value = (unsigned_long *)
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                      (in_stack_ffffffffffffff78);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffff78);
  __base = (int)((ulong)pcVar2 >> 0x20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffff78);
  _Var5 = std::from_chars<unsigned_long>(in_stack_ffffffffffffffc8,in_RDI,__value,__base);
  pcVar2 = _Var5.ptr;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffff78);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_ffffffffffffff78);
  if ((pcVar2 == pcVar3 + sVar4) && (_Var5.ec == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_18;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON integer out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

Int UniValue::getInt() const
{
    static_assert(std::is_integral<Int>::value);
    checkType(VNUM);
    Int result;
    const auto [first_nonmatching, error_condition] = std::from_chars(val.data(), val.data() + val.size(), result);
    if (first_nonmatching != val.data() + val.size() || error_condition != std::errc{}) {
        throw std::runtime_error("JSON integer out of range");
    }
    return result;
}